

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::ExportObjectCompileCommand
          (cmNinjaTargetGenerator *this,string *language,string *sourceFileName,string *objectDir,
          string *objectFileName,string *objectFileDir,string *flags,string *defines,
          string *includes)

{
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  int iVar3;
  cmGlobalNinjaGenerator *pcVar4;
  char *pcVar5;
  undefined4 extraout_var;
  cmOutputConverter *outputConverter;
  pointer s;
  string cmdLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string escapedSourceFileName;
  RuleVariables compileObjectVars;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string *local_148;
  string *local_140;
  string local_138;
  RuleVariables local_118;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_140 = objectFileName;
  std::__cxx11::string::string
            ((string *)&local_118,"CMAKE_EXPORT_COMPILE_COMMANDS",(allocator *)&local_138);
  bVar2 = cmMakefile::IsOn(this_00,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  if (bVar2) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables(&local_118);
    local_118.Language = (language->_M_dataplus)._M_p;
    std::__cxx11::string::string((string *)&local_138,(string *)sourceFileName);
    bVar2 = cmsys::SystemTools::FileIsFullPath((sourceFileName->_M_dataplus)._M_p);
    if (!bVar2) {
      pcVar4 = GetGlobalGenerator(this);
      pcVar5 = cmake::GetHomeOutputDirectory
                         ((pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      cmsys::SystemTools::CollapseFullPath(&local_1a8,&local_138,pcVar5);
      std::__cxx11::string::operator=((string *)&local_138,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    local_148 = sourceFileName;
    cmOutputConverter::ConvertToOutputFormat
              (&local_1a8,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_138,SHELL);
    std::__cxx11::string::operator=((string *)&local_138,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    local_118.Source = local_138._M_dataplus._M_p;
    local_118.Object = (local_140->_M_dataplus)._M_p;
    local_118.ObjectDir = (objectDir->_M_dataplus)._M_p;
    local_118.ObjectFileDir = (objectFileDir->_M_dataplus)._M_p;
    local_118.Flags = (flags->_M_dataplus)._M_p;
    local_118.Defines = (defines->_M_dataplus)._M_p;
    local_118.Includes = (includes->_M_dataplus)._M_p;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = std::operator==(language,"CUDA");
    if (bVar2) {
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      local_1a8._M_string_length = 0;
      local_1a8.field_2._M_local_buf[0] = '\0';
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::__cxx11::string::string
                ((string *)&local_1c8,"CUDA_SEPARABLE_COMPILATION",(allocator *)&local_168);
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&local_1c8,"CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION",
                   (allocator *)&local_168);
      }
      else {
        pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
        std::__cxx11::string::string
                  ((string *)&local_1c8,"CUDA_PTX_COMPILATION",(allocator *)&local_168);
        bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        if (bVar2) {
          std::__cxx11::string::string
                    ((string *)&local_1c8,"CMAKE_CUDA_COMPILE_PTX_COMPILATION",
                     (allocator *)&local_168);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&local_1c8,"CMAKE_CUDA_COMPILE_WHOLE_COMPILATION",
                     (allocator *)&local_168);
        }
      }
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      pcVar5 = cmMakefile::GetRequiredDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,&local_1a8);
      std::__cxx11::string::string((string *)&local_1c8,pcVar5,(allocator *)&local_168);
      cmSystemTools::ExpandListArgument(&local_1c8,&local_188,false);
    }
    else {
      std::__cxx11::string::string((string *)&local_168,"CMAKE_",&local_1c9);
      std::operator+(&local_1c8,&local_168,language);
      std::operator+(&local_1a8,&local_1c8,"_COMPILE_OBJECT");
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_168);
      pcVar5 = cmMakefile::GetRequiredDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,&local_1a8);
      std::__cxx11::string::string((string *)&local_1c8,pcVar5,(allocator *)&local_168);
      cmSystemTools::ExpandListArgument(&local_1c8,&local_188,false);
    }
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    iVar3 = (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              _vptr_cmLocalGenerator[5])();
    local_1c8._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar3);
    for (s = local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        s != local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
      outputConverter =
           &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
            super_cmOutputConverter;
      if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                ((cmRulePlaceholderExpander *)local_1c8._M_dataplus._M_p,outputConverter,s,
                 &local_118);
    }
    cmLocalNinjaGenerator::BuildCommandLine(&local_1a8,this->LocalGenerator,&local_188);
    pcVar4 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddCXXCompileCommand(pcVar4,&local_1a8,local_148);
    std::__cxx11::string::~string((string *)&local_1a8);
    cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr
              ((auto_ptr<cmRulePlaceholderExpander> *)&local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_188);
    std::__cxx11::string::~string((string *)&local_138);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportObjectCompileCommand(
  std::string const& language, std::string const& sourceFileName,
  std::string const& objectDir, std::string const& objectFileName,
  std::string const& objectFileDir, std::string const& flags,
  std::string const& defines, std::string const& includes)
{
  if (!this->Makefile->IsOn("CMAKE_EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = language.c_str();

  std::string escapedSourceFileName = sourceFileName;

  if (!cmSystemTools::FileIsFullPath(sourceFileName.c_str())) {
    escapedSourceFileName = cmSystemTools::CollapseFullPath(
      escapedSourceFileName, this->GetGlobalGenerator()
                               ->GetCMakeInstance()
                               ->GetHomeOutputDirectory());
  }

  escapedSourceFileName = this->LocalGenerator->ConvertToOutputFormat(
    escapedSourceFileName, cmOutputConverter::SHELL);

  compileObjectVars.Source = escapedSourceFileName.c_str();
  compileObjectVars.Object = objectFileName.c_str();
  compileObjectVars.ObjectDir = objectDir.c_str();
  compileObjectVars.ObjectFileDir = objectFileDir.c_str();
  compileObjectVars.Flags = flags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (language == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION");
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_PTX_COMPILATION");
    } else {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_WHOLE_COMPILATION");
    }
    std::string compileCmd =
      this->GetMakefile()->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar =
      std::string("CMAKE_") + language + "_COMPILE_OBJECT";
    std::string compileCmd =
      this->GetMakefile()->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  for (std::vector<std::string>::iterator i = compileCmds.begin();
       i != compileCmds.end(); ++i) {
    // no launcher for CMAKE_EXPORT_COMPILE_COMMANDS
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), *i,
                                                 compileObjectVars);
  }

  std::string cmdLine =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  this->GetGlobalGenerator()->AddCXXCompileCommand(cmdLine, sourceFileName);
}